

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

ssize_t __thiscall hdc::Parser::read(Parser *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  SourceFile *pSVar2;
  Import *import;
  Def *def;
  Class *klass;
  GlobalVariable *var;
  GlobalConstant *var_00;
  Struct *s;
  undefined4 in_register_00000034;
  string local_1c0;
  vector<hdc::Token,_std::allocator<hdc::Token>_> local_1a0;
  Lex lex;
  
  Lex::Lex(&lex);
  std::__cxx11::string::string((string *)&local_1c0,(string *)CONCAT44(in_register_00000034,__fd));
  Lex::getTokens(&local_1a0,&lex,&local_1c0);
  std::vector<hdc::Token,_std::allocator<hdc::Token>_>::_M_move_assign(&this->tokens,&local_1a0);
  std::vector<hdc::Token,_std::allocator<hdc::Token>_>::~vector(&local_1a0);
  std::__cxx11::string::~string((string *)&local_1c0);
  pSVar2 = (SourceFile *)operator_new(0xd0);
  SourceFile::SourceFile(pSVar2,(string *)CONCAT44(in_register_00000034,__fd));
  this->file = pSVar2;
  (this->current_token)._M_current =
       (this->tokens).super__Vector_base<hdc::Token,_std::allocator<hdc::Token>_>._M_impl.
       super__Vector_impl_data._M_start;
  std::__cxx11::string::_M_assign((string *)&this->filePath);
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              bVar1 = lookahead(this,TK_IMPORT);
              if (!bVar1) break;
              pSVar2 = this->file;
              import = parse_import(this);
              SourceFile::addImport(pSVar2,import);
            }
            bVar1 = lookahead(this,TK_DEF);
            if (!bVar1) break;
            pSVar2 = this->file;
            def = parse_def(this);
            SourceFile::addDef(pSVar2,def);
          }
          bVar1 = lookahead(this,TK_CLASS);
          if (!bVar1) break;
          pSVar2 = this->file;
          klass = parse_class(this);
          SourceFile::addClass(pSVar2,klass);
        }
        bVar1 = lookahead(this,TK_VAR);
        if (!bVar1) break;
        pSVar2 = this->file;
        var = parse_global_variable(this);
        SourceFile::addGlobalVariable(pSVar2,var);
      }
      bVar1 = lookahead(this,TK_CONSTANT);
      if (!bVar1) break;
      pSVar2 = this->file;
      var_00 = parse_global_constant(this);
      SourceFile::addGlobalConstant(pSVar2,var_00);
    }
    bVar1 = lookahead(this,TK_STRUCT);
    pSVar2 = this->file;
    if (!bVar1) break;
    s = parse_struct(this);
    SourceFile::addStruct(pSVar2,s);
  }
  Lex::~Lex(&lex);
  return (ssize_t)pSVar2;
}

Assistant:

SourceFile* Parser::read(std::string path) {
    Lex lex;

    tokens = lex.getTokens(path);
    file = new SourceFile(path);
    current_token = tokens.begin();
    filePath = path;

    while (true) { 
        if (lookahead(TK_IMPORT)) {
            file->addImport(parse_import());
        } else if (lookahead(TK_DEF)) {
            file->addDef(parse_def());
        } else if (lookahead(TK_CLASS)) {
            file->addClass(parse_class());
        } else if (lookahead(TK_VAR)) {
            file->addGlobalVariable(parse_global_variable());
        } else if (lookahead(TK_CONSTANT)) {
            file->addGlobalConstant(parse_global_constant());
        } else if (lookahead(TK_STRUCT)) {
            file->addStruct(parse_struct());
        } else {
            break;
        }
    }

    return file;
}